

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteMessageDocComment(Printer *printer,Descriptor *message)

{
  Descriptor *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Printer *unaff_retaddr;
  char *in_stack_00000008;
  Printer *in_stack_00000010;
  Descriptor *in_stack_00000028;
  Printer *in_stack_00000030;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  
  io::Printer::Print<>(unaff_retaddr,(char *)in_RDI);
  WriteDocCommentBody<google::protobuf::Descriptor>(in_stack_00000030,in_stack_00000028);
  Descriptor::full_name_abi_cxx11_(in_RSI);
  EscapeJavadoc(in_stack_ffffffffffffffe8);
  io::Printer::Print<char[9],std::__cxx11::string>
            (in_stack_00000010,in_stack_00000008,&unaff_retaddr->variable_delimiter_,in_RDI);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void WriteMessageDocComment(io::Printer* printer, const Descriptor* message) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, message);
  printer->Print(
      " * Protobuf type {@code $fullname$}\n"
      " */\n",
      "fullname", EscapeJavadoc(message->full_name()));
}